

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SchemaValidator::reset(SchemaValidator *this)

{
  SchemaValidator *this_local;
  
  this->fTrailing = false;
  this->fSeenNonWhiteSpace = false;
  this->fSeenId = false;
  ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::removeAllElements(this->fTypeStack);
  if (this->fXsiType != (QName *)0x0) {
    (*(this->fXsiType->super_XSerializable)._vptr_XSerializable[1])();
  }
  this->fXsiType = (QName *)0x0;
  this->fCurrentDatatypeValidator = (DatatypeValidator *)0x0;
  this->fNil = false;
  this->fNilFound = false;
  XMLBuffer::reset(&this->fDatatypeBuffer);
  this->fErrorOccurred = false;
  return;
}

Assistant:

void SchemaValidator::reset()
{
    fTrailing = false;
    fSeenNonWhiteSpace = false;
    fSeenId = false;
	fTypeStack->removeAllElements();
    delete fXsiType;
    fXsiType = 0;
    fCurrentDatatypeValidator = 0;
    fNil = false;
    fNilFound = false;
    fDatatypeBuffer.reset();
    fErrorOccurred = false;
}